

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int matchmemaddr(expr **iex,expr **niex1,expr **niex2,expr **piex,expr *expr,int flip)

{
  etype eVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  eVar1 = expr->type;
joined_r0x0016a808:
  do {
    if (eVar1 - EXPR_PIADD < 2) {
      iVar2 = 0;
      if ((flip == 0) && (expr->expr2->isimm != 0)) {
        iVar2 = 0;
        iVar3 = matchmemaddr(iex,niex1,niex2,piex,expr->expr1,0);
        if (iVar3 != 0) {
          flip = (int)(expr->type == EXPR_PISUB);
          expr = expr->expr2;
          iex = piex;
LAB_0016a8df:
          addexpr(iex,expr,flip);
LAB_0016a8e4:
          iVar2 = 1;
        }
      }
      return iVar2;
    }
    if (expr->isimm != 0) goto LAB_0016a8df;
    if (eVar1 != EXPR_ADD) {
      if (eVar1 == EXPR_NEG) {
        lVar4 = 0x20;
      }
      else {
        if (eVar1 != EXPR_SUB) {
          if (flip == 0) {
            if ((niex1 != (expr **)0x0) && (*niex1 == (expr *)0x0)) {
              *niex1 = expr;
              goto LAB_0016a8e4;
            }
            if (niex2 != (expr **)0x0) {
              if (*niex2 != (expr *)0x0) {
                return 0;
              }
              *niex2 = expr;
              goto LAB_0016a8e4;
            }
          }
          return 0;
        }
        iVar2 = matchmemaddr(iex,niex1,niex2,piex,expr->expr1,flip);
        lVar4 = 0x28;
        if (iVar2 == 0) {
          return 0;
        }
      }
      expr = *(expr **)((long)&expr->type + lVar4);
      eVar1 = expr->type;
      flip = (int)(flip == 0);
      goto joined_r0x0016a808;
    }
    iVar2 = matchmemaddr(iex,niex1,niex2,piex,expr->expr1,flip);
    if (iVar2 == 0) {
      return 0;
    }
    expr = expr->expr2;
    eVar1 = expr->type;
  } while( true );
}

Assistant:

int matchmemaddr(const struct expr **iex, const struct expr **niex1, const struct expr **niex2, const struct expr **piex, const struct expr *expr, int flip) {
	if (expr->type == EXPR_PIADD || expr->type == EXPR_PISUB) {
		if (flip || !expr->expr2->isimm)
			return 0;
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, 0) && addexpr(piex, expr->expr2, expr->type == EXPR_PISUB);
	}
	if (expr->isimm)
		return addexpr(iex, expr, flip);
	if (expr->type == EXPR_ADD)
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, flip) && matchmemaddr(iex, niex1, niex2, piex, expr->expr2, flip);
	if (expr->type == EXPR_SUB)
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, flip) && matchmemaddr(iex, niex1, niex2, piex, expr->expr2, !flip);
	if (expr->type == EXPR_NEG)
		return matchmemaddr(iex, niex1, niex2, piex, expr->expr1, !flip);
	if (flip)
		return 0;
	if (niex1 && !*niex1)
		*niex1 = expr;
	else if (niex2 && !*niex2)
		*niex2 = expr;
	else
		return 0;
	return 1;
}